

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_options.h
# Opt level: O0

void BamTools::Options::AddValueOption<unsigned_int,unsigned_int_const>
               (string *argument,string *valueDescription,string *optionDescription,
               string *valueTypeDescription,bool *foundArgument,uint *val,OptionGroup *group,
               uint *defaultValue)

{
  Option *this;
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  undefined8 in_R8;
  Variant *in_R9;
  OptionValue ov;
  Option o;
  OptionValue *in_stack_fffffffffffffee8;
  Variant *in_stack_fffffffffffffef0;
  value_type *__x;
  OptionValue *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  uint v;
  Option *in_stack_ffffffffffffff10;
  string local_e8 [16];
  key_type *in_stack_ffffffffffffff28;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::OptionValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::OptionValue>_>_>
  *in_stack_ffffffffffffff30;
  value_type local_a0;
  Variant *local_30;
  uint uStack_24;
  string *local_20;
  string *local_18;
  string *local_10;
  string *local_8;
  
  uStack_24 = (uint)((ulong)in_R8 >> 0x20);
  v = (uint)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  __x = &local_a0;
  local_30 = in_R9;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Option::Option(in_stack_ffffffffffffff10);
  std::__cxx11::string::operator=((string *)__x,local_8);
  std::__cxx11::string::operator=((string *)&local_a0.ValueDescription,local_10);
  std::__cxx11::string::operator=((string *)&local_a0.Description,local_18);
  Variant::Variant<unsigned_int>((Variant *)in_stack_ffffffffffffff10,v);
  Variant::operator=(in_stack_fffffffffffffef0,(Variant *)in_stack_fffffffffffffee8);
  Variant::~Variant(in_stack_fffffffffffffef0);
  local_a0.HasDefaultValue = true;
  std::vector<BamTools::Option,_std::allocator<BamTools::Option>_>::push_back
            ((vector<BamTools::Option,_std::allocator<BamTools::Option>_> *)
             in_stack_ffffffffffffff00,__x);
  OptionValue::OptionValue(in_stack_ffffffffffffff00);
  Variant::Variant<unsigned_int>(local_30,uStack_24);
  Variant::operator=(in_stack_fffffffffffffef0,(Variant *)in_stack_fffffffffffffee8);
  Variant::~Variant(in_stack_fffffffffffffef0);
  std::__cxx11::string::empty();
  std::__cxx11::string::operator=(local_e8,local_20);
  this = (Option *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::OptionValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::OptionValue>_>_>
         ::operator[](in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  OptionValue::operator=((OptionValue *)this,in_stack_fffffffffffffee8);
  OptionValue::~OptionValue((OptionValue *)this);
  Option::~Option(this);
  return;
}

Assistant:

void Options::AddValueOption(const std::string& argument, const std::string& valueDescription,
                             const std::string& optionDescription,
                             const std::string& valueTypeDescription, bool& foundArgument, T& val,
                             OptionGroup* group, D& defaultValue)
{
    Option o;
    o.Argument = argument;
    o.ValueDescription = valueDescription;
    o.Description = optionDescription;
    o.DefaultValue = defaultValue;
    o.HasDefaultValue = true;
    group->Options.push_back(o);

    OptionValue ov;
    ov.pFoundArgument = &foundArgument;
    ov.pValue = (void*)&val;
    ov.VariantValue = val;
    ov.IsRequired = (valueTypeDescription.empty() ? false : true);
    ov.ValueTypeDescription = valueTypeDescription;
    m_optionsMap[argument] = ov;
}